

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_fd.c
# Opt level: O2

ssize_t file_read(archive *a,void *client_data,void **buff)

{
  int error_number;
  ssize_t sVar1;
  int *piVar2;
  char *fmt;
  
  *buff = *(void **)((long)client_data + 0x10);
  do {
    sVar1 = read(*client_data,*(void **)((long)client_data + 0x10),
                 *(size_t *)((long)client_data + 8));
    if (-1 < sVar1) {
      return sVar1;
    }
    piVar2 = __errno_location();
    error_number = *piVar2;
  } while (error_number == 4);
  if (*(int *)((long)client_data + 0x20) == 1) {
    fmt = "Error reading \'%s\'";
  }
  else {
    if (*(int *)((long)client_data + 0x20) == 0) {
      archive_set_error(a,error_number,"Error reading stdin");
      return sVar1;
    }
    fmt = "Error reading \'%S\'";
  }
  archive_set_error(a,error_number,fmt,(long)client_data + 0x24);
  return sVar1;
}

Assistant:

static ssize_t
file_read(struct archive *a, void *client_data, const void **buff)
{
	struct read_fd_data *mine = (struct read_fd_data *)client_data;
	ssize_t bytes_read;

	*buff = mine->buffer;
	for (;;) {
		bytes_read = read(mine->fd, mine->buffer, mine->block_size);
		if (bytes_read < 0) {
			if (errno == EINTR)
				continue;
			archive_set_error(a, errno, "Error reading fd %d",
			    mine->fd);
		}
		return (bytes_read);
	}
}